

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int net_service_lookup(char *service)

{
  uint16_t uVar1;
  servent *psVar2;
  servent *se;
  char *service_local;
  
  psVar2 = getservbyname(service,(char *)0x0);
  if (psVar2 == (servent *)0x0) {
    service_local._4_4_ = 0;
  }
  else {
    uVar1 = ntohs((uint16_t)psVar2->s_port);
    service_local._4_4_ = (uint)uVar1;
  }
  return service_local._4_4_;
}

Assistant:

int net_service_lookup(const char *service)
{
    struct servent *se;
    se = getservbyname(service, NULL);
    if (se != NULL)
        return ntohs(se->s_port);
    else
        return 0;
}